

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>::iterator::
operator++(iterator *this)

{
  bool bVar1;
  MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_> *pMVar2;
  iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *this_00;
  iterator *in_RDI;
  iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  iVar3;
  Chain **local_28;
  iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
  *in_stack_ffffffffffffffe8;
  
  in_RDI->e = &(*in_RDI->e)->next;
  if (*in_RDI->e == (Chain *)0x0) {
    iVar3 = QHashPrivate::
            iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
            ::operator++(in_stack_ffffffffffffffe8);
    this_00 = (iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               *)iVar3.bucket;
    bVar1 = QHashPrivate::
            iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
            ::atEnd(&in_RDI->i);
    if (bVar1) {
      local_28 = (Chain **)0x0;
    }
    else {
      pMVar2 = QHashPrivate::
               iterator<QHashPrivate::MultiNode<unsigned_long_long,_std::shared_ptr<const_QGradientCache::CacheInfo>_>_>
               ::node(this_00);
      local_28 = &pMVar2->value;
    }
    in_RDI->e = local_28;
  }
  return in_RDI;
}

Assistant:

inline iterator &operator++() noexcept {
            Q_ASSERT(e && *e);
            e = &(*e)->next;
            Q_ASSERT(e);
            if (!*e) {
                ++i;
                e = i.atEnd() ? nullptr : &i.node()->value;
            }
            return *this;
        }